

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Httpdata.cpp
# Opt level: O2

void __thiscall Httpdata::handle_http(Httpdata *this,char *buff)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *__lhs;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Http_Handle *this_01;
  size_type sVar5;
  mapped_type *pmVar6;
  DIR *__dirp;
  dirent *pdVar7;
  char *__addr;
  ostream *poVar8;
  string body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string send_str;
  allocator local_ea;
  allocator local_e9;
  string head;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int index;
  Http_Handle *local_80;
  Httpdata *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  index = 0;
  this_01 = (Http_Handle *)operator_new(0xb8);
  Http_Handle::Http_Handle(this_01);
  handle_request_line(this,buff,&index,this_01);
  handle_request_head(this,buff,&index,this_01);
  std::__cxx11::string::string((string *)&head,"Connection",(allocator *)&local_130);
  this_00 = &this_01->request_head;
  sVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&this_00->_M_h,&head);
  if (sVar5 == 0) {
    std::__cxx11::string::~string((string *)&head);
  }
  else {
    std::__cxx11::string::string((string *)&body,"Connection",(allocator *)&local_c8);
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,&body);
    bVar1 = std::operator==(pmVar6,"keep-alive");
    if (bVar1) {
      std::__cxx11::string::~string((string *)&body);
      std::__cxx11::string::~string((string *)&head);
    }
    else {
      std::__cxx11::string::string((string *)&send_str,"Connection",(allocator *)&local_a8);
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&send_str);
      bVar1 = std::operator==(pmVar6,"Keep-Alive");
      std::__cxx11::string::~string((string *)&send_str);
      std::__cxx11::string::~string((string *)&body);
      std::__cxx11::string::~string((string *)&head);
      if (!bVar1) goto LAB_00111035;
    }
    (this->super_channel).field_0x8c = 1;
  }
LAB_00111035:
  std::__cxx11::string::string((string *)&head,"",(allocator *)&body);
  std::__cxx11::string::string((string *)&body,"",(allocator *)&send_str);
  __lhs = &this_01->URI;
  bVar1 = std::operator==(__lhs,"/");
  if (bVar1) {
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    __dirp = opendir("/source");
    if (__dirp != (DIR *)0x0) {
      local_80 = this_01;
      local_78 = this;
LAB_0011118b:
      pdVar7 = readdir(__dirp);
      if (pdVar7 != (dirent *)0x0) {
        if ((byte)pdVar7->d_name[0] == 0x2e) goto code_r0x001111a8;
        iVar3 = 0x2e - (uint)(byte)pdVar7->d_name[0];
        goto LAB_001111c4;
      }
      closedir(__dirp);
      this = local_78;
      this_01 = local_80;
    }
    std::__cxx11::string::append((char *)&body);
    std::operator+(&send_str,&this_01->_version," 200 OK\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&send_str);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::to_string(&local_c8,body._M_string_length);
    std::operator+(&local_130,"Content-Length: ",&local_c8);
    std::operator+(&send_str,&local_130,"\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&send_str);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)&head);
    goto LAB_001118a9;
  }
  bVar1 = std::operator==(__lhs,"/hello");
  if (bVar1) {
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::operator+(&send_str,&this_01->_version," 200 OK\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&send_str);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::to_string(&local_c8,body._M_string_length);
    std::operator+(&local_130,"Content-Length: ",&local_c8);
    std::operator+(&send_str,&local_130,"\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&send_str);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)&head);
    goto LAB_001118a9;
  }
  std::__cxx11::string::string((string *)&send_str,(string *)__lhs);
  iVar3 = open(send_str._M_dataplus._M_p,0);
  if (iVar3 < 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"openfail");
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_0011177d:
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::operator+(&local_130,&this_01->_version," 404 NOTFOUND\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::to_string(&local_a8,body._M_string_length);
    std::operator+(&local_c8,"Content-Length: ",&local_a8);
    std::operator+(&local_130,&local_c8,"\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::append((char *)&head);
  }
  else {
    if (iVar3 == 0) goto LAB_0011177d;
    __addr = (char *)mmap((void *)0x0,0x1000,1,1,iVar3,0);
    if (__addr == (char *)0xffffffffffffffff) goto LAB_0011177d;
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)__lhs);
    std::operator+(&local_c8,"<title>",&local_a8);
    std::operator+(&local_130,&local_c8,"</title>");
    std::__cxx11::string::append((string *)&body);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::append((char *)&body);
    std::__cxx11::string::string((string *)&local_130,__addr,(allocator *)&local_c8);
    std::__cxx11::string::append((string *)&body);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::append((char *)&body);
    std::operator+(&local_130,&this_01->_version," 200 OK\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::string::append((char *)&head);
    std::__cxx11::to_string(&local_a8,body._M_string_length);
    std::operator+(&local_c8,"Content-Length: ",&local_a8);
    std::operator+(&local_130,&local_c8,"\r\n");
    std::__cxx11::string::append((string *)&head);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::append((char *)&head);
    iVar4 = munmap(__addr,0x1000);
    if (iVar4 != 0) {
      __assert_fail("munmap((void*)ptr,4096) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/Httpdata.cpp"
                    ,0x88,"void Httpdata::handle_http(char *)");
    }
    close(iVar3);
  }
  std::__cxx11::string::~string((string *)&send_str);
LAB_001118a9:
  Http_Handle::~Http_Handle(this_01);
  operator_delete(this_01);
  std::operator+(&send_str,&head,&body);
  strcpy((this->super_channel).write_buff,send_str._M_dataplus._M_p);
  (this->super_channel).write_length = (int)send_str._M_string_length;
  (*(this->super_channel)._vptr_channel[5])(this);
  std::__cxx11::string::~string((string *)&send_str);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)&head);
  return;
code_r0x001111a8:
  if (pdVar7->d_name[1] != '\0') {
    uVar2 = (byte)pdVar7->d_name[1] - 0x2e;
    if (uVar2 == 0) {
      uVar2 = (uint)(byte)pdVar7->d_name[2];
    }
    iVar3 = -uVar2;
LAB_001111c4:
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&local_50,pdVar7->d_name,&local_e9);
      std::operator+(&local_a8,"<br><a href=\"/source/",&local_50);
      std::operator+(&local_c8,&local_a8,"\">");
      std::__cxx11::string::string((string *)&local_70,pdVar7->d_name,&local_ea);
      std::operator+(&local_130,&local_c8,&local_70);
      std::operator+(&send_str,&local_130,anon_var_dwarf_365ec + 0x2f);
      std::__cxx11::string::append((string *)&body);
      std::__cxx11::string::~string((string *)&send_str);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  goto LAB_0011118b;
}

Assistant:

void Httpdata::handle_http(char *buff)
{
    int index = 0;
    Http_Handle *Recv_Http = new Http_Handle();
    handle_request_line(buff,index,Recv_Http);
    handle_request_head(buff,index,Recv_Http);
    if(Recv_Http->request_head.count("Connection") != 0 &&  
        (Recv_Http->request_head["Connection"] == "keep-alive" || 
        Recv_Http->request_head["Connection"] == "Keep-Alive") )
    {
        Keep_Alive = true;
    }
    string head = "";
    string body = "";
    //if(Recv_Http->URI == "222")
    if(Recv_Http->URI == "/")
    {
        body += "<html><title>Source Page</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "!Thank for visiting MRWu_haha's Server!";
        body += "<meta http-equiv=\"Content-Type\" content=\"text/html; charset=utf-8\" />";
        body += "<br><a href=\"http://www.baidu.com\">百度一下</a>";
        body += "<br><a href=\"https://join.qq.com\">腾讯招聘</a>";
        body += "<br><a href=\"https://campus.kuaishou.cn\">快手招聘</a>";
        body += "<br><a href=\"https://uniportal.huawei.com\">华为招聘</a>";
        body += "<br><a href=\"https://campus.163.com\">网易招聘</a>";
        body += "<br><a href=\"https://careers.pinduoduo.com\">拼多多招聘</a>";
        body += "<br><a href=\"https://campus.alibaba.com\">阿里巴巴招聘</a>";
        body += "<br><a href=\"https://campus.bigo.sg\">BIGO招聘</a><br>";
        body += "<font size=\"5\"> MR-Wuhaha's Source Flie List: </font><br/>";
        DIR* source = opendir("/source");
        if(source != nullptr)
        {
            dirent* p_entry = nullptr;
            while((p_entry = readdir(source)) != nullptr)
            {
                if(!(p_entry->d_type & S_IFDIR) && (strcmp(".", p_entry->d_name) != 0 && strcmp("..", p_entry->d_name) != 0))
                {
                    body += "<br><a href=\"/source/" + string(p_entry->d_name) + "\">" + string(p_entry->d_name) + "</a>";
                }
            }
            closedir(source);
        }

        body += "</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else if(Recv_Http->URI == "/hello")
    {
        body += "<html><title>Hello</title>";
        body += "<body bgcolor=\"ffffff\">";
        body += "Thank for visiting this server!!!!";
        body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
        head += Recv_Http->_version + " 200 OK\r\n";
        head += "Connection: Keep-Alive\r\n";
        head += "Content-Type: text/html\r\n";
        head += "Content-Length: " + to_string(body.size()) + "\r\n";
        head += "\r\n";
    }
    else
    {
        string request_file_name = Recv_Http->URI;
        int request_fd = open(request_file_name.c_str(),O_RDONLY);
        if(request_fd < 0)
        {
            cout<<"openfail"<<endl;
        }
        char* ptr = nullptr;
        if(request_fd > 0 && (ptr = (char*)mmap(NULL,4096,PROT_READ,MAP_SHARED,request_fd,0)) != MAP_FAILED)
        {
            body += "<html>";
            body += "<title>" + Recv_Http->URI.substr(1) +  "</title>";
            body += "<head>";
            body += "<meta http-equiv=\"content-type\" content=\"text/html; charset=utf-8\">";
            body += "</head>";
            body += "<body bgcolor=\"ffffff\">";
            body += "MR_Wuhaha's WebServer";
            body += "<hr><pre style=\"word-wrap: break-word; white-space: pre-wrap; white-space: -moz-pre-wrap\">";
            body += string(ptr);
            body += "</pre>\n</body></html>";
            head += Recv_Http->_version + " 200 OK\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
            assert(munmap((void*)ptr,4096) == 0);
            close(request_fd);
        }
        else
        {
            body += "<html><title>Source Not Found</title>";
            body += "<body bgcolor=\"ffffff\">";
            body += "404 NOT_FOUND";
            body += "<hr><em> MR_Wuhaha's WebServer </em>\n</body></html>";
            head += Recv_Http->_version + " 404 NOTFOUND\r\n";
            head += "Connection: Keep-Alive\r\n";
            head += "Content-Type: text/html\r\n";
            head += "Content-Length: " + to_string(body.size()) + "\r\n";
            head += "\r\n";
        }
    }
    delete Recv_Http;
    string send_str = head + body;
    sprintf(write_buff, "%s", send_str.c_str());
    write_length = send_str.length();
    HandleWrite();
}